

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secure.h
# Opt level: O2

secure_unique_ptr<std::array<unsigned_char,_32UL>_>
make_secure_unique<std::array<unsigned_char,32ul>>(void)

{
  array<unsigned_char,_32UL> *paVar1;
  __uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
  in_RDI;
  long in_FS_OFFSET;
  secure_allocator<std::array<unsigned_char,_32UL>_> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = secure_allocator<std::array<unsigned_char,_32UL>_>::allocate(&local_11,1);
  paVar1->_M_elems[0x10] = '\0';
  paVar1->_M_elems[0x11] = '\0';
  paVar1->_M_elems[0x12] = '\0';
  paVar1->_M_elems[0x13] = '\0';
  paVar1->_M_elems[0x14] = '\0';
  paVar1->_M_elems[0x15] = '\0';
  paVar1->_M_elems[0x16] = '\0';
  paVar1->_M_elems[0x17] = '\0';
  paVar1->_M_elems[0x18] = '\0';
  paVar1->_M_elems[0x19] = '\0';
  paVar1->_M_elems[0x1a] = '\0';
  paVar1->_M_elems[0x1b] = '\0';
  paVar1->_M_elems[0x1c] = '\0';
  paVar1->_M_elems[0x1d] = '\0';
  paVar1->_M_elems[0x1e] = '\0';
  paVar1->_M_elems[0x1f] = '\0';
  paVar1->_M_elems[0] = '\0';
  paVar1->_M_elems[1] = '\0';
  paVar1->_M_elems[2] = '\0';
  paVar1->_M_elems[3] = '\0';
  paVar1->_M_elems[4] = '\0';
  paVar1->_M_elems[5] = '\0';
  paVar1->_M_elems[6] = '\0';
  paVar1->_M_elems[7] = '\0';
  paVar1->_M_elems[8] = '\0';
  paVar1->_M_elems[9] = '\0';
  paVar1->_M_elems[10] = '\0';
  paVar1->_M_elems[0xb] = '\0';
  paVar1->_M_elems[0xc] = '\0';
  paVar1->_M_elems[0xd] = '\0';
  paVar1->_M_elems[0xe] = '\0';
  paVar1->_M_elems[0xf] = '\0';
  *(array<unsigned_char,_32UL> **)
   in_RDI.
   super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl = paVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
            )(tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              )in_RDI.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

secure_unique_ptr<T> make_secure_unique(Args&&... as)
{
    T* p = secure_allocator<T>().allocate(1);

    // initialize in place, and return as secure_unique_ptr
    try {
        return secure_unique_ptr<T>(new (p) T(std::forward(as)...));
    } catch (...) {
        secure_allocator<T>().deallocate(p, 1);
        throw;
    }
}